

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewDelimiter(LocationUpdater *this,BinaryLocation oldAddr)

{
  ulong uVar1;
  Expression *pEVar2;
  uint *puVar3;
  __hash_code __code;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  DelimiterInfo DVar8;
  
  DVar8 = AddrExprMap::getDelimiter(&this->oldExprAddrMap,oldAddr);
  pEVar2 = DVar8.expr;
  if (pEVar2 != (Expression *)0x0) {
    uVar1 = (this->newLocations->delimiters)._M_h._M_bucket_count;
    uVar4 = (ulong)pEVar2 % uVar1;
    p_Var6 = (this->newLocations->delimiters)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var6->_M_nxt, p_Var7 = p_Var6, pEVar2 != (Expression *)p_Var6->_M_nxt[1]._M_nxt))
    {
      while (p_Var6 = p_Var5, p_Var5 = p_Var6->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6, pEVar2 == (Expression *)p_Var5[1]._M_nxt)) goto LAB_00c903c7;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00c903c7:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var7->_M_nxt;
    }
    if (p_Var5 != (_Hash_node_base *)0x0) {
      puVar3 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                         ((ZeroInitSmallVector<unsigned_int,_1UL> *)(p_Var5 + 2),DVar8.id);
      return *puVar3;
    }
  }
  return 0;
}

Assistant:

BinaryLocation getNewDelimiter(BinaryLocation oldAddr) const {
    auto info = oldExprAddrMap.getDelimiter(oldAddr);
    if (info.expr) {
      auto iter = newLocations.delimiters.find(info.expr);
      if (iter != newLocations.delimiters.end()) {
        return iter->second[info.id];
      }
    }
    return 0;
  }